

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tflags.h
# Opt level: O3

void __thiscall AActor::ClearCounters(AActor *this)

{
  uint uVar1;
  
  uVar1 = (this->flags).Value;
  if (((uVar1 & 0x8400000) == 0x400000) && (0 < this->health)) {
    level.total_monsters = level.total_monsters + -1;
    uVar1 = uVar1 & 0xf7bfffff;
    (this->flags).Value = uVar1;
  }
  if ((uVar1 >> 0x17 & 1) != 0) {
    level.total_items = level.total_items + -1;
    (this->flags).Value = uVar1 & 0xff7fffff;
  }
  uVar1 = (this->flags5).Value;
  if ((uVar1 & 0x10) != 0) {
    level.total_secrets = level.total_secrets + -1;
    (this->flags5).Value = uVar1 & 0xffffffef;
  }
  return;
}

Assistant:

Self operator& (T value) const { return Self::FromInt (Value & value); }